

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lowmc_test.c
# Opt level: O0

int LowMC_test_vector_192_192_4_4(void)

{
  int iVar1;
  uint8_t ciphertext_expected [24];
  uint8_t plaintext [24];
  uint8_t key [24];
  uint8_t *in_stack_ffffffffffffffe0;
  
  iVar1 = lowmc_enc((lowmc_parameters_t *)0x3d940023827d9d56,in_stack_ffffffffffffffe0,
                    (uint8_t *)0x392efca3aee092c9,(uint8_t *)0x8cd7df26daf798d5);
  return iVar1;
}

Assistant:

static int LowMC_test_vector_192_192_4_4(void) {
  const uint8_t key[24] = {
      0x56, 0x9d, 0x7d, 0x82, 0x23, 0x0,  0x94, 0x3d, 0x94, 0x83, 0x47, 0x74,
      0x27, 0xe8, 0x8e, 0xa2, 0x27, 0xa2, 0xe3, 0x17, 0x2c, 0x4,  0xbc, 0xd3,
  };
  const uint8_t plaintext[24] = {
      0xae, 0xeb, 0x9d, 0x5b, 0x61, 0xa2, 0xa5, 0x6d, 0xd5, 0x98, 0xf7, 0xda,
      0x26, 0xdf, 0xd7, 0x8c, 0xc9, 0x92, 0xe0, 0xae, 0xa3, 0xfc, 0x2e, 0x39,
  };
  const uint8_t ciphertext_expected[24] = {
      0x86, 0x98, 0x70, 0xae, 0x65, 0x47, 0xad, 0xa, 0xfe, 0xf2, 0x77, 0x93,
      0x17, 0xd,  0x96, 0xbc, 0x78, 0xe0, 0x40, 0x9, 0x69, 0x44, 0x80, 0x8f,
  };
  return lowmc_enc(&parameters_192_192_4, key, plaintext, ciphertext_expected);
}